

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::autoRescalePartials
          (BeagleCPUImpl<double,_1,_0> *this,double *destP,short *scaleFactors)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  double dVar8;
  undefined1 auVar9 [64];
  undefined1 auVar10 [16];
  int expMax;
  int local_44;
  long local_40;
  short *local_38;
  
  iVar4 = this->kPatternCount;
  if (0 < iVar4) {
    iVar2 = this->kCategoryCount;
    local_40 = 0;
    local_38 = scaleFactors;
    do {
      iVar1 = this->kPartialsPaddedStateCount;
      if (iVar2 < 1) {
        dVar8 = 0.0;
      }
      else {
        iVar3 = iVar1 * (int)local_40;
        auVar9 = ZEXT1664(ZEXT816(0));
        iVar6 = 0;
        do {
          if (0 < this->kStateCount) {
            lVar7 = 0;
            do {
              auVar10._8_8_ = 0;
              auVar10._0_8_ = destP[iVar3 + lVar7];
              lVar7 = lVar7 + 1;
              auVar10 = vmaxsd_avx(auVar10,auVar9._0_16_);
              auVar9 = ZEXT1664(auVar10);
            } while (this->kStateCount != (int)lVar7);
          }
          dVar8 = auVar9._0_8_;
          iVar6 = iVar6 + 1;
          iVar3 = iVar3 + this->kPaddedPatternCount * iVar1;
        } while (iVar6 != iVar2);
      }
      frexp(dVar8,&local_44);
      local_38[local_40] = (short)local_44;
      iVar2 = this->kCategoryCount;
      if (0 < iVar2 && local_44 != 0) {
        iVar4 = this->kStateCount;
        iVar5 = (int)local_40;
        iVar6 = -local_44;
        iVar3 = 0;
        do {
          if (0 < iVar4) {
            iVar2 = this->kPaddedPatternCount * this->kPartialsPaddedStateCount * iVar3 +
                    iVar1 * iVar5;
            lVar7 = 0;
            do {
              dVar8 = ldexp(1.0,iVar6);
              destP[iVar2 + lVar7] = dVar8 * destP[iVar2 + lVar7];
              lVar7 = lVar7 + 1;
              iVar4 = this->kStateCount;
            } while ((int)lVar7 < iVar4);
            iVar2 = this->kCategoryCount;
          }
          iVar3 = iVar3 + 1;
        } while (iVar3 < iVar2);
        iVar4 = this->kPatternCount;
      }
      local_40 = local_40 + 1;
    } while (local_40 < iVar4);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::autoRescalePartials(REALTYPE* destP,
                                              signed short* scaleFactors) {


    for (int k = 0; k < kPatternCount; k++) {
        REALTYPE max = 0;
        const int patternOffset = k * kPartialsPaddedStateCount;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * kPartialsPaddedStateCount + patternOffset;
            for (int i = 0; i < kStateCount; i++) {
                if(destP[offset] > max)
                    max = destP[offset];
                offset++;
            }
        }

        int expMax;
        frexp(max, &expMax);
        scaleFactors[k] = expMax;

        if (expMax != 0) {
            for (int l = 0; l < kCategoryCount; l++) {
                int offset = l * kPaddedPatternCount * kPartialsPaddedStateCount + patternOffset;
                for (int i = 0; i < kStateCount; i++)
                    destP[offset++] *= pow(2.0, -expMax);
            }
        }
    }
}